

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int findvidx(rnndb *db,rnnenum *en,char *name)

{
  int iVar1;
  char *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int i;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (*(int *)(in_RSI + 0xb) <= local_24) {
      fprintf(_stderr,"Cannot find variant %s in enum %s!\n",in_RDX,*in_RSI);
      *(undefined4 *)(in_RDI + 0x80) = 1;
      return -1;
    }
    iVar1 = strcmp((char *)**(undefined8 **)(in_RSI[10] + (long)local_24 * 8),in_RDX);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

static int findvidx (struct rnndb *db, struct rnnenum *en, char *name) {
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcmp(en->vals[i]->name, name))
			return i;
	fprintf (stderr, "Cannot find variant %s in enum %s!\n", name, en->name);
	db->estatus = 1;
	return -1;
}